

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourcesDictionary.cpp
# Opt level: O0

void __thiscall ResourcesDictionary::~ResourcesDictionary(ResourcesDictionary *this)

{
  ResourcesDictionary *this_local;
  
  ~ResourcesDictionary(this);
  operator_delete(this,0x1d0);
  return;
}

Assistant:

ResourcesDictionary::~ResourcesDictionary(void)
{
}